

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::HttpServerErrorHandler::handleNoResponse(HttpServerErrorHandler *this,Response *response)

{
  Disposer *node;
  long *plVar1;
  undefined8 *in_RDX;
  StringPtr value;
  Own<kj::AsyncOutputStream,_std::nullptr_t> body;
  HttpHeaderTable headerTable;
  HttpHeaders headers;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_d8;
  long *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  HttpHeaderTable local_b0;
  HttpHeaders local_78;
  
  HttpHeaderTable::HttpHeaderTable(&local_b0);
  HttpHeaders::HttpHeaders(&local_78,&local_b0);
  value.content.size_ = 0xb;
  value.content.ptr = "text/plain";
  anon_unknown_36::requireValidHeaderValue(value);
  local_78.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
  local_78.indexedHeaders.ptr[0xe].content.size_ = 0xb;
  local_c0 = 1;
  local_b8 = 0x33;
  (**(code **)*in_RDX)(&local_d8.ptr);
  (**(code **)*local_c8)
            (&local_d8,local_c8,"ERROR: The HttpService did not generate a response.",0x33);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,&local_d8);
  node = local_d8.disposer;
  if ((PromiseArenaMember *)local_d8.disposer != (PromiseArenaMember *)0x0) {
    local_d8.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  plVar1 = local_c8;
  if (local_c8 != (long *)0x0) {
    local_c8 = (long *)0x0;
    (**(local_d8.ptr)->_vptr_AsyncOutputStream)
              (local_d8.ptr,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  HttpHeaders::~HttpHeaders(&local_78);
  HttpHeaderTable::~HttpHeaderTable(&local_b0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServerErrorHandler::handleNoResponse(kj::HttpService::Response& response) {
  HttpHeaderTable headerTable {};
  HttpHeaders headers(headerTable);
  headers.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

  constexpr auto errorMessage = "ERROR: The HttpService did not generate a response."_kj;
  auto body = response.send(500, "Internal Server Error", headers, errorMessage.size());

  return body->write(errorMessage.asBytes()).attach(kj::mv(body));
}